

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O3

raw_problem *
baryonyx::make_problem(raw_problem *__return_storage_ptr__,context_ptr *ctx,string *filename)

{
  context *ctx_00;
  char cVar1;
  ifstream ifs;
  istream local_220 [520];
  
  ctx_00 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  if (ctx_00 == (context *)0x0) {
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).value = 0.0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->type = maximize;
    __return_storage_ptr__->status = empty_context;
  }
  else {
    info<std::__cxx11::string>(ctx_00,"problem reads from file `{}\'\n",filename);
    std::ifstream::ifstream(local_220,(string *)filename,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      (__return_storage_ptr__->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->vars).names.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vars).names.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->vars).names.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->vars).values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vars).values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->vars).values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->objective).value = 0.0;
      (__return_storage_ptr__->equal_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->equal_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->equal_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->greater_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->greater_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->greater_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->less_constraints).
      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->objective).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->objective).qelements.
      super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->type = maximize;
      __return_storage_ptr__->status = file_not_found;
    }
    else {
      make_problem(__return_storage_ptr__,
                   (ctx->_M_t).
                   super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
                   super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
                   super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl,local_220);
    }
    std::ifstream::~ifstream(local_220);
  }
  return __return_storage_ptr__;
}

Assistant:

raw_problem
make_problem(const baryonyx::context_ptr& ctx, const std::string& filename)
{
    if (ctx) {
        info(*ctx, "problem reads from file `{}'\n", filename);

        std::ifstream ifs(filename);
        if (!ifs.is_open())
            return raw_problem(
              baryonyx::file_format_error_tag::file_not_found);

        return make_problem(*ctx, ifs);
    }

    return raw_problem{ baryonyx::file_format_error_tag::empty_context };
}